

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7_arr_func_3.cpp
# Opt level: O0

void show_array(double *ar,int n)

{
  ostream *poVar1;
  void *this;
  int local_18;
  int i;
  int n_local;
  double *ar_local;
  
  for (local_18 = 0; local_18 < n; local_18 = local_18 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Property #");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18 + 1);
    std::operator<<(poVar1," : $");
    this = (void *)std::ostream::operator<<(&std::cout,ar[local_18]);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void show_array (const double ar[], int n)
{
    using namespace std;
    for (int i = 0; i < n; i++)
    {
        cout << "Property #" << (i + 1) << " : $";
        cout << ar[i] << endl;
    }
}